

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpirvIntrinsics.cpp
# Opt level: O1

TSpirvInstruction * __thiscall
glslang::TParseContext::makeSpirvInstruction
          (TParseContext *this,TSourceLoc *loc,TString *name,TString *value)

{
  int iVar1;
  TPoolAllocator *this_00;
  TSpirvInstruction *this_01;
  
  this_00 = GetThreadPoolAllocator();
  this_01 = (TSpirvInstruction *)TPoolAllocator::allocate(this_00,0x30);
  TSpirvInstruction::TSpirvInstruction(this_01);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(name,"set");
  if (iVar1 == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_assign((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)this_01,
              value);
  }
  else {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"unknown SPIR-V instruction qualifier",(name->_M_dataplus)._M_p,"");
  }
  return this_01;
}

Assistant:

TSpirvInstruction* TParseContext::makeSpirvInstruction(const TSourceLoc& loc, const TString& name, const TString& value)
{
    TSpirvInstruction* spirvInst = new TSpirvInstruction;
    if (name == "set")
        spirvInst->set = value;
    else
        error(loc, "unknown SPIR-V instruction qualifier", name.c_str(), "");

    return spirvInst;
}